

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void __thiscall
google::protobuf::json_internal::ParseProto2Descriptor::SetString
          (ParseProto2Descriptor *this,Field f,Msg *msg,string_view x)

{
  Message *pMVar1;
  Msg *pMVar2;
  bool bVar3;
  Reflection *pRVar4;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Field local_28;
  Msg *msg_local;
  Field f_local;
  string_view x_local;
  
  x_local._M_len = x._M_len;
  local_28 = f;
  msg_local = (Msg *)this;
  f_local = (Field)msg;
  RecordAsSeen((Field)this,(Msg *)f);
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)msg_local);
  if (bVar3) {
    pRVar4 = Message::GetReflection(*(Message **)local_28);
    pMVar2 = msg_local;
    pMVar1 = *(Message **)local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_48,(basic_string_view<char,_std::char_traits<char>_> *)&f_local,
               &local_49);
    Reflection::AddString(pRVar4,pMVar1,(FieldDescriptor *)pMVar2,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    pRVar4 = Message::GetReflection(*(Message **)local_28);
    pMVar2 = msg_local;
    pMVar1 = *(Message **)local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&f_local,
               &local_81);
    Reflection::SetString(pRVar4,pMVar1,(FieldDescriptor *)pMVar2,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return;
}

Assistant:

static void SetString(Field f, Msg& msg, absl::string_view x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddString(msg.msg_, f, std::string(x));
    } else {
      msg.msg_->GetReflection()->SetString(msg.msg_, f, std::string(x));
    }
  }